

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O2

void Abc_NtkMaxFlowTest(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  int i;
  int iVar5;
  
  for (iVar5 = 0; iVar5 < pNtk->vPos->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(pNtk->vPos,iVar5);
    *(byte *)((long)pvVar2 + 0x14) = *(byte *)((long)pvVar2 + 0x14) | 0x10;
  }
  for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,iVar5);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
      puVar1 = (uint *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      pAVar3->field_0x14 = pAVar3->field_0x14 | 0x10;
    }
  }
  pVVar4 = Abc_NtkMaxFlow(pNtk,1,1);
  Vec_PtrFree(pVVar4);
  Abc_NtkCleanMarkA(pNtk);
  for (iVar5 = 0; iVar5 < pNtk->vPis->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(pNtk->vPis,iVar5);
    *(byte *)((long)pvVar2 + 0x14) = *(byte *)((long)pvVar2 + 0x14) | 0x10;
  }
  for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,iVar5);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
      puVar1 = (uint *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      pAVar3->field_0x14 = pAVar3->field_0x14 | 0x10;
    }
  }
  pVVar4 = Abc_NtkMaxFlow(pNtk,0,1);
  Vec_PtrFree(pVVar4);
  Abc_NtkCleanMarkA(pNtk);
  return;
}

Assistant:

void Abc_NtkMaxFlowTest( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMinCut;
    Abc_Obj_t * pObj;
    int i;

    // forward flow
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->fMarkA = Abc_ObjFanin0(pObj)->fMarkA = 1;
//        Abc_ObjFanin0(pObj)->fMarkA = 1;
    vMinCut = Abc_NtkMaxFlow( pNtk, 1, 1 );
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );

    // backward flow
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->fMarkA = Abc_ObjFanout0(pObj)->fMarkA = 1;
//        Abc_ObjFanout0(pObj)->fMarkA = 1;
    vMinCut = Abc_NtkMaxFlow( pNtk, 0, 1 );
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );

}